

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O0

bool __thiscall Shell::TermAlgebra::finiteDomain(TermAlgebra *this)

{
  uint uVar1;
  Array<Shell::TermAlgebraConstructor_*> *in_RDI;
  uint i;
  size_t in_stack_ffffffffffffffd8;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    if ((uint)in_RDI->_capacity <= local_14) {
      return true;
    }
    Lib::Array<Shell::TermAlgebraConstructor_*>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    uVar1 = TermAlgebraConstructor::arity((TermAlgebraConstructor *)0xd0f075);
    if (uVar1 != 0) break;
    local_14 = local_14 + 1;
  }
  return false;
}

Assistant:

bool TermAlgebra::finiteDomain()
{
  for (unsigned i = 0; i < _n; i++) {
    if (_constrs[i]->arity() > 0) {
      return false;
    }
  }

  return true;
}